

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O1

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  uint uVar1;
  pointer pFVar2;
  pointer pSVar3;
  pointer pFVar4;
  ulong uVar5;
  pointer pBVar6;
  ulong uVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  RBDLError *pRVar11;
  long lVar12;
  SrcEvaluatorType srcEvaluator_1;
  Matrix3d *pMVar13;
  SpatialTransform *pSVar14;
  Body *pBVar15;
  Scalar *pSVar16;
  SpatialTransform *pSVar17;
  undefined8 *puVar18;
  SpatialTransform *pSVar19;
  Matrix3d *pMVar20;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator_2;
  byte bVar21;
  Body parent_body;
  FixedBody fixed_parent;
  FixedBody fbody;
  string local_388;
  string local_368;
  Body local_348;
  SpatialRigidBodyInertia local_2d8;
  uint local_270;
  SpatialTransform local_268;
  undefined8 auStack_208 [9];
  undefined8 local_1c0;
  double dStack_1b8;
  double local_1b0;
  value_type local_160;
  
  bVar21 = 0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_160.mBaseTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_160.mBaseTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_160.mMass = body->mMass;
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_160.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (body->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  local_160.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] =
       (body->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  local_160.mParentTransform.E.super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (joint_frame->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  local_160.mParentTransform.r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (joint_frame->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  uVar7 = (ulong)(parent_id - model->fixed_body_discriminator);
  local_160.mMovableParent = parent_id;
  if ((parent_id != 0xffffffff && model->fixed_body_discriminator <= parent_id) &&
     (uVar5 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
     uVar7 <= uVar5 && uVar5 - uVar7 != 0)) {
    pFVar2 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar4 = pFVar2 + uVar7;
    local_2d8.m = pFVar4->mMass;
    local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         *(double *)
          &(pFVar4->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = *(double *)((long)&(pFVar4->mCenterOfMass).super_Vector3d + 8);
    local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&(pFVar4->mCenterOfMass).super_Vector3d + 0x10);
    pMVar13 = &pFVar4->mInertia;
    pSVar16 = &local_2d8.Ixx;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pSVar16 = *(Scalar *)
                  &(pMVar13->super_Matrix3d).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar13 = (Matrix3d *)
                ((long)&(pMVar13->super_Matrix3d).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> + 8);
      pSVar16 = pSVar16 + 1;
    }
    local_270 = pFVar4->mMovableParent;
    pSVar19 = &pFVar2[uVar7].mParentTransform;
    pSVar14 = pSVar19;
    pSVar17 = &local_268;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar14->E;
      pSVar14 = (SpatialTransform *)((long)&pSVar14->E + 8);
      pSVar17 = (SpatialTransform *)
                ((pSVar17->E).super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                + 1);
    }
    local_268.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pSVar19->r + 0x10);
    local_268.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = *(double *)&(pSVar19->r).super_Vector3d;
    local_268.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = *(double *)((long)&pSVar19->r + 8);
    pSVar14 = &pFVar2[uVar7].mBaseTransform;
    puVar18 = auStack_208;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *(undefined8 *)&pSVar14->E;
      pSVar14 = (SpatialTransform *)((long)&pSVar14->E + 8);
      puVar18 = puVar18 + 1;
    }
    local_1b0 = *(double *)((long)(pSVar19 + 1) + 0x58);
    local_1c0 = *(undefined8 *)&((Vector3d *)((long)(pSVar19 + 1) + 0x48))->super_Vector3d;
    dStack_1b8 = *(double *)((long)(pSVar19 + 1) + 0x50);
    local_160.mMovableParent = local_270;
    RigidBodyDynamics::Math::SpatialTransform::operator*
              ((SpatialTransform *)&local_348,joint_frame,&local_268);
    pBVar15 = &local_348;
    pSVar19 = &local_160.mParentTransform;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pSVar19->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (((Matrix3d *)&pBVar15->mMass)->super_Matrix3d).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      pBVar15 = (Body *)((long)pBVar15 + (ulong)bVar21 * -0x10 + 8);
      pSVar19 = (SpatialTransform *)((long)pSVar19 + (ulong)bVar21 * -0x10 + 8);
    }
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
    local_160.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
  }
  pBVar6 = (model->mBodies).
           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           .
           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           ._M_impl.super__Vector_impl_data._M_start + local_160.mMovableParent;
  local_348.mMass = pBVar6->mMass;
  local_348.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(pBVar6->mCenterOfMass).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
  local_348.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)((long)&(pBVar6->mCenterOfMass).super_Vector3d + 8);
  local_348.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)((long)&(pBVar6->mCenterOfMass).super_Vector3d + 0x10);
  pMVar13 = &pBVar6->mInertia;
  pMVar20 = &local_348.mInertia;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pMVar20->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[0] =
         *(double *)
          &(pMVar13->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
    pMVar13 = (Matrix3d *)((long)pMVar13 + ((ulong)bVar21 * -2 + 1) * 8);
    pMVar20 = (Matrix3d *)((long)pMVar20 + ((ulong)bVar21 * -2 + 1) * 8);
  }
  local_348.mIsVirtual = pBVar6->mIsVirtual;
  RigidBodyDynamics::Body::Join(&local_348,&local_160.mParentTransform,body);
  pBVar15 = (model->mBodies).
            super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            .
            super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ._M_impl.super__Vector_impl_data._M_start + local_160.mMovableParent;
  if (pBVar15 != &local_348) {
    pBVar15->mMass = local_348.mMass;
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
    (pBVar15->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] =
         local_348.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
    (pBVar15->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_348.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    (pBVar15->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_348.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (pBVar15->mCenterOfMass).super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_348.mCenterOfMass.super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pBVar15->mIsVirtual = local_348.mIsVirtual;
  }
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_2d8,local_348.mMass,&local_348.mCenterOfMass,&local_348.mInertia);
  uVar7 = (ulong)local_160.mMovableParent;
  pSVar3 = (model->I).
           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3[uVar7].m = local_2d8.m;
  *(double *)&pSVar3[uVar7].h.super_Vector3d =
       local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  *(double *)((long)&pSVar3[uVar7].h.super_Vector3d + 8) =
       local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  *(double *)((long)&pSVar3[uVar7].h.super_Vector3d + 0x10) =
       local_2d8.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  pSVar3[uVar7].Ixx = local_2d8.Ixx;
  (&pSVar3[uVar7].Ixx)[1] = local_2d8.Iyx;
  pSVar3[uVar7].Iyy = local_2d8.Iyy;
  (&pSVar3[uVar7].Iyy)[1] = local_2d8.Izx;
  pSVar3[uVar7].Izy = local_2d8.Izy;
  (&pSVar3[uVar7].Izy)[1] = local_2d8.Izz;
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(&(model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ,&local_160);
  uVar7 = ((long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
  if (uVar7 < ~model->fixed_body_discriminator || uVar7 - ~model->fixed_body_discriminator == 0) {
    if (body_name->_M_string_length != 0) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(&(model->mBodyNameMap)._M_t,body_name);
      if ((_Rb_tree_header *)iVar8._M_node !=
          &(model->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"Error: Body with name \'",0x17);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_2d8,(body_name->_M_dataplus)._M_p,
                             body_name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\' already exists!",0x11);
        std::endl<char,std::char_traits<char>>(poVar10);
        pRVar11 = (RBDLError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        RigidBodyDynamics::Errors::RBDLError::RBDLError(pRVar11,&local_388);
        __cxa_throw(pRVar11,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
                    RigidBodyDynamics::Errors::RBDLError::~RBDLError);
      }
      pFVar4 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar2 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = model->fixed_body_discriminator;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&model->mBodyNameMap,body_name);
      *pmVar9 = (uVar1 + (int)((ulong)((long)pFVar4 - (long)pFVar2) >> 4) * 0x286bca1b) - 1;
    }
    return ((int)((ulong)((long)(model->mFixedBodies).
                                super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                                .
                                super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(model->mFixedBodies).
                               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                               .
                               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x286bca1b +
           model->fixed_body_discriminator) - 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d8,"Error: cannot add more than ",0x1c);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," fixed bodies. You need to modify ",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"Model::fixed_body_discriminator for this.",0x29);
  std::endl<char,std::char_traits<char>>(poVar10);
  pRVar11 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  RigidBodyDynamics::Errors::RBDLError::RBDLError(pRVar11,&local_368);
  __cxa_throw(pRVar11,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
              RigidBodyDynamics::Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int AddBodyFixedJoint (
  Model &model,
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  FixedBody fbody = FixedBody::CreateFromBody (body);
  fbody.mMovableParent = parent_id;
  fbody.mParentTransform = joint_frame;

  if (model.IsFixedBodyId(parent_id)) {
    FixedBody fixed_parent =
      model.mFixedBodies[parent_id - model.fixed_body_discriminator];

    fbody.mMovableParent = fixed_parent.mMovableParent;
    fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
  }

  // merge the two bodies
  Body parent_body = model.mBodies[fbody.mMovableParent];
  parent_body.Join (fbody.mParentTransform, body);
  model.mBodies[fbody.mMovableParent] = parent_body;
  model.I[fbody.mMovableParent] =
    SpatialRigidBodyInertia::createFromMassComInertiaC (
      parent_body.mMass,
      parent_body.mCenterOfMass,
      parent_body.mInertia);

  model.mFixedBodies.push_back (fbody);

  if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() -
      model.fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg  << "Error: cannot add more than "
              << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size()
              << " fixed bodies. You need to modify "
              << "Model::fixed_body_discriminator for this."
              << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  if (body_name.size() != 0) {
    if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    model.mBodyNameMap[body_name] = model.mFixedBodies.size()
                                    + model.fixed_body_discriminator - 1;
  }

  return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}